

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bool fmt::v7::detail::dragonbox::divisible_by_power_of_2(uint32_t x,int exp)

{
  int iVar1;
  int exp_local;
  uint32_t x_local;
  
  if (exp < 1) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/format-inl.h"
                ,0x6d9,"");
  }
  if (x != 0) {
    iVar1 = 0;
    for (; (x & 1) == 0; x = x >> 1 | 0x80000000) {
      iVar1 = iVar1 + 1;
    }
    return exp <= iVar1;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/format-inl.h"
              ,0x6da,"");
}

Assistant:

inline bool divisible_by_power_of_2(uint32_t x, int exp) FMT_NOEXCEPT {
  FMT_ASSERT(exp >= 1, "");
  FMT_ASSERT(x != 0, "");
#ifdef FMT_BUILTIN_CTZ
  return FMT_BUILTIN_CTZ(x) >= exp;
#else
  return exp < num_bits<uint32_t>() && x == ((x >> exp) << exp);
#endif
}